

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O2

double __thiscall
jsoncons::cbor::
basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::get_double(basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
             *this,error_code *ec)

{
  binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_00;
  type_conflict2 tVar1;
  uint8_t b;
  uint8_t buf [4];
  uint8_t buf_1 [8];
  
  this_00 = &this->source_;
  tVar1 = binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::read<std::random_access_iterator_tag>(this_00,&b,1);
  if (tVar1 != 0) {
    if ((b & 0x1f) == 0x1b) {
      tVar1 = binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::read<std::random_access_iterator_tag>(this_00,buf_1,8);
      if (tVar1 == 8) {
        return (double)((ulong)buf_1 >> 0x38 | ((ulong)buf_1 & 0xff000000000000) >> 0x28 |
                        ((ulong)buf_1 & 0xff0000000000) >> 0x18 | ((ulong)buf_1 & 0xff00000000) >> 8
                        | ((ulong)buf_1 & 0xff000000) << 8 | ((ulong)buf_1 & 0xff0000) << 0x18 |
                        ((ulong)buf_1 & 0xff00) << 0x28 | (long)buf_1 << 0x38);
      }
    }
    else {
      if ((b & 0x1f) != 0x1a) {
        return 0.0;
      }
      tVar1 = binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::read<std::random_access_iterator_tag>(this_00,buf,4);
      if (tVar1 == 4) {
        return (double)(float)((uint)buf >> 0x18 | ((uint)buf & 0xff0000) >> 8 |
                               ((uint)buf & 0xff00) << 8 | (int)buf << 0x18);
      }
    }
  }
  std::error_code::operator=(ec,unexpected_eof);
  this->more_ = false;
  return 0.0;
}

Assistant:

double get_double(std::error_code& ec)
    {
        double val = 0;

        uint8_t b;
        if (source_.read(&b, 1) == 0)
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return 0;
        }
        uint8_t info = get_additional_information_value(b);
        switch (info)
        {
        case 0x1a: // Single-Precision Float (four-byte IEEE 754)
            {
                uint8_t buf[sizeof(float)];
                if (source_.read(buf, sizeof(float)) !=sizeof(float)) 
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return 0;
                }
                val = binary::big_to_native<float>(buf, sizeof(buf));
                break;
            }

        case 0x1b: //  Double-Precision Float (eight-byte IEEE 754)
            {
                uint8_t buf[sizeof(double)];
                if (source_.read(buf, sizeof(double)) != sizeof(double))
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return 0;
                }
                val = binary::big_to_native<double>(buf, sizeof(buf));
                break;
            }
            default:
                break;
        }
        
        return val;
    }